

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e
ktxPrintKTX2InfoJSONForMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktx_uint32_t base_indent,ktx_uint32_t indent_width,
          _Bool minified)

{
  ktx_error_code_e kVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined1 in_R8B;
  ktxStream stream;
  ktx_error_code_e result;
  ktx_size_t in_stack_ffffffffffffff88;
  ktx_uint8_t *in_stack_ffffffffffffff90;
  ktxStream *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffe4;
  ktx_uint32_t base_indent_00;
  
  base_indent_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  kVar1 = ktxMemStream_construct_ro
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxPrintKTX2InfoJSONForStream
                      ((ktxStream *)CONCAT44(in_EDX,in_ECX),base_indent_00,0,
                       (_Bool)in_stack_ffffffffffffffdf);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoJSONForMemory(const ktx_uint8_t* bytes, ktx_size_t size, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoJSONForStream(&stream, base_indent, indent_width, minified);
    return result;
}